

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  CMUnitTest tests [17];
  
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar6 = (ulong)puVar2[2];
  uVar4 = *puVar2 >> 4;
  uVar1 = uVar4 - 0x2065;
  if (10 < uVar1) {
LAB_00102ba3:
    switch(uVar4) {
    case 0x1066:
switchD_00102d5e_caseD_1066:
      pcVar7 = "Merom";
      goto LAB_00102e7e;
    case 0x1067:
    case 0x106d:
      pcVar7 = "Penryn";
      goto LAB_00102e7e;
    case 0x1068:
    case 0x1069:
    case 0x106b:
    case 0x106c:
switchD_00102d5e_caseD_1068:
      pcVar7 = "unknown";
      goto LAB_00102e7e;
    case 0x106a:
    case 0x106e:
      goto switchD_00102d5e_caseD_106a;
    default:
      if (uVar4 - 99 < 2) {
        pcVar7 = "Prescott";
        goto LAB_00102e7e;
      }
      if (uVar4 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_00102e7e;
      }
      if (uVar4 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x66) {
        pcVar7 = "Presler";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x6d) {
        pcVar7 = "Dothan";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x6f) goto switchD_00102d5e_caseD_1066;
      if (uVar4 == 0x16c) {
        pcVar7 = "Pineview";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x266) {
        pcVar7 = "Lincroft";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x366) {
        pcVar7 = "Cedarview";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x30f1) goto LAB_00102d6c;
      if (uVar4 == 0x60f10) {
        pcVar7 = "Zen4";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x506c) {
LAB_00102dcc:
        pcVar7 = "Goldmont";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x506e) {
        pcVar7 = "Skylake";
        goto LAB_00102e7e;
      }
      if (uVar4 == 0x606a) {
LAB_00102dd8:
        pcVar7 = "Icelake";
      }
      else {
        if ((uVar4 != 0x60f0) && (uVar4 != 0x60f8)) {
          if (uVar4 == 0x706a) goto LAB_00102dcc;
          if (uVar4 == 0x706e) goto LAB_00102dd8;
          if (uVar4 != 0x70f1) {
            if (uVar4 != 0x806e) {
              if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
                pcVar7 = "Alderlake";
                goto LAB_00102e7e;
              }
              if (uVar4 != 0x906e) {
                if (uVar4 != 0x90f0) {
                  if (uVar4 == 0xa067) {
                    pcVar7 = "Rocketlake";
                    goto LAB_00102e7e;
                  }
                  if (uVar4 == 0xb067) {
                    pcVar7 = "Raptorlake";
                    goto LAB_00102e7e;
                  }
                  if (uVar4 != 0x20f10) {
                    if (uVar4 == 0x40f40) {
                      pcVar7 = "Zen3+";
                      goto LAB_00102e7e;
                    }
                    if (uVar4 != 0x50f00) {
                      if (uVar4 == 0x406c) {
                        pcVar7 = "CherryTrail";
                        goto LAB_00102e7e;
                      }
                      goto switchD_00102d5e_caseD_1068;
                    }
                  }
                  pcVar7 = "Zen3";
                  goto LAB_00102e7e;
                }
                goto LAB_00102d6c;
              }
            }
            pcVar7 = "Kabylake";
            goto LAB_00102e7e;
          }
        }
LAB_00102d6c:
        pcVar7 = "Zen2";
      }
      goto LAB_00102e7e;
    }
  }
  uVar6 = 0x481;
  if ((0x481U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar7 = "Westmere";
    goto LAB_00102e7e;
  }
  uVar6 = 0x120;
  if ((0x120U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar7 = "SandyBridge";
    goto LAB_00102e7e;
  }
  if (uVar1 != 9) goto LAB_00102ba3;
switchD_00102d5e_caseD_106a:
  pcVar7 = "Nehalem";
LAB_00102e7e:
  printf("x64 processor:  %s\t",pcVar7,uVar6);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar3 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar3 + 0xc) != '@') {
    lVar3 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(undefined4 *)(lVar3 + 0xc),
           (ulong)*(uint *)(lVar3 + 8));
  }
  memcpy(tests,&PTR_anon_var_dwarf_7a_00120b30,0x2a8);
  iVar5 = _cmocka_run_group_tests("tests",tests,0x11,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar5;
}

Assistant:

int main() {
    tellmeall();
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(equal_array_array_test),
        cmocka_unit_test(equal_bitset_bitset_test),
        cmocka_unit_test(equal_run_run_test),
        cmocka_unit_test(equal_array_bitset_test),
        cmocka_unit_test(equal_bitset_array_test),
        cmocka_unit_test(equal_array_run_test),
        cmocka_unit_test(equal_run_array_test),
        cmocka_unit_test(equal_bitset_run_test),
        cmocka_unit_test(equal_run_bitset_test),
        cmocka_unit_test(subset_array_array_test),
        cmocka_unit_test(subset_bitset_bitset_test),
        cmocka_unit_test(subset_run_run_test),
        cmocka_unit_test(subset_array_bitset_test),
        cmocka_unit_test(subset_array_run_test),
        cmocka_unit_test(subset_run_array_test),
        cmocka_unit_test(subset_bitset_run_test),
        cmocka_unit_test(subset_run_bitset_test),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
}